

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O2

void __thiscall despot::POMDPX::PrintModel(POMDPX *this,ostream *out)

{
  ostream *poVar1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  vStack_68;
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  local_50;
  _Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_> local_38;
  
  poVar1 = std::operator<<(out,"Parser pointer = ");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"is_small = ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"Min reward action = ");
  poVar1 = despot::operator<<(poVar1,&this->min_reward_action_);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"Max reward action = ");
  poVar1 = despot::operator<<(poVar1,&this->max_reward_action_);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"States = ");
  std::vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>::vector
            ((vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_> *)&local_38,
             &this->states_);
  poVar1 = despot::operator<<(poVar1,(vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>
                                      *)&local_38);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::_Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>::~_Vector_base
            (&local_38);
  poVar1 = std::operator<<(out,"Transitions = ");
  std::
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ::vector(&local_50,&this->transition_probabilities_);
  poVar1 = despot::operator<<(poVar1,&local_50);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ::~vector(&local_50);
  poVar1 = std::operator<<(out,"Rewards = ");
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&vStack_68,&this->rewards_);
  poVar1 = despot::operator<<(poVar1,&vStack_68);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&vStack_68);
  poVar1 = std::operator<<(out,"MemoryPool = ");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void POMDPX::PrintModel(ostream& out) const {
	out << "Parser pointer = " << parser_ << endl;
	out << "is_small = " << is_small_ << endl;

	out << "Min reward action = " << min_reward_action_ << endl;
	out << "Max reward action = " << max_reward_action_ << endl;

	out << "States = " << states_ << endl;
	out << "Transitions = " << transition_probabilities_ << endl;
	out << "Rewards = " << rewards_ << endl;
	out << "MemoryPool = " << &memory_pool_ << endl;
}